

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O3

void __thiscall QtPrivate::QCalendarView::mouseReleaseEvent(QCalendarView *this,QMouseEvent *event)

{
  int iVar1;
  long lVar2;
  QDate QVar3;
  QStyle *pQVar4;
  long in_FS_OFFSET;
  undefined1 local_61;
  qint64 local_60;
  void *local_58;
  qint64 *local_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QAbstractItemView::model((QAbstractItemView *)this);
  lVar2 = QMetaObject::cast((QObject *)&QCalendarModel::staticMetaObject);
  if (lVar2 == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QAbstractItemView::mouseReleaseEvent((QAbstractItemView *)this,event);
      return;
    }
  }
  else {
    if ((*(int *)(event + 0x40) == 1) && (this->readOnly == false)) {
      if (this->validDateClicked == true) {
        QVar3 = handleMouseEvent(this,event);
        if (QVar3.jd + 0xb69eeff91fU < 0x16d3e147974) {
          local_48 = &local_61;
          local_61 = 1;
          local_58 = (void *)0x0;
          local_60 = QVar3.jd;
          local_50 = &local_60;
          QMetaObject::activate((QObject *)this,&staticMetaObject,1,&local_58);
          local_58 = (void *)0x0;
          local_60 = QVar3.jd;
          local_50 = &local_60;
          QMetaObject::activate((QObject *)this,&staticMetaObject,2,&local_58);
          pQVar4 = QWidget::style((QWidget *)this);
          iVar1 = (**(code **)(*(long *)pQVar4 + 0xf0))(pQVar4,0x3d,0,this,0);
          if (iVar1 != 0) {
            QMetaObject::activate((QObject *)this,&staticMetaObject,3,(void **)0x0);
          }
        }
        this->validDateClicked = false;
      }
      else {
        event[0xc] = (QMouseEvent)0x0;
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarView::mouseReleaseEvent(QMouseEvent *event)
{
    QCalendarModel *calendarModel = qobject_cast<QCalendarModel *>(model());
    if (!calendarModel) {
        QTableView::mouseReleaseEvent(event);
        return;
    }

    if (event->button() != Qt::LeftButton)
        return;

    if (readOnly)
        return;

    if (validDateClicked) {
        QDate date = handleMouseEvent(event);
        if (date.isValid()) {
            emit changeDate(date, true);
            emit clicked(date);
            if (style()->styleHint(QStyle::SH_ItemView_ActivateItemOnSingleClick, nullptr, this))
                emit editingFinished();
        }
        validDateClicked = false;
    } else {
        event->ignore();
    }
}